

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O1

void itemHelp(FILE *fp,poptItem items,wchar_t nitems,columns_t columns,char *translation_domain)

{
  undefined1 uVar1;
  undefined7 uVar2;
  poptOption *opt;
  
  uVar2 = (undefined7)((ulong)columns >> 8);
  uVar1 = nitems < L'\x01' || items == (poptItem)0x0;
  if (nitems >= L'\x01' && items != (poptItem)0x0) {
    do {
      if ((((items->option).longName != (char *)0x0) || ((items->option).shortName != '\0')) &&
         (((items->option).argInfo & 0x40000000) == 0)) {
        singleOptionHelp(fp,columns,&items->option,(char *)CONCAT71(uVar2,uVar1));
      }
      items = items + 1;
      nitems = nitems + L'\xffffffff';
    } while (nitems != L'\0');
  }
  return;
}

Assistant:

static void itemHelp(FILE * fp,
		poptItem items, int nitems,
		columns_t columns,
		const char * translation_domain)
{
    poptItem item;
    int i;

    if (items != NULL)
    for (i = 0, item = items; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN))
	    singleOptionHelp(fp, columns, opt, translation_domain);
    }
}